

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

int32_t __thiscall
icu_63::ResourceDataValue::getStringArrayOrStringAsArray
          (ResourceDataValue *this,UnicodeString *dest,int32_t capacity,UErrorCode *errorCode)

{
  ResourceData *pResData;
  int32_t iVar1;
  ConstChar16Ptr local_60 [3];
  int32_t sLength;
  
  if ((this->res & 0xfffffffe) == 8) {
    pResData = this->pResData;
    (*(this->super_ResourceValue).super_UObject._vptr_UObject[10])
              ((ResourceArray *)&sLength,this,errorCode);
    iVar1 = anon_unknown.dwarf_3e9123::getStringArray
                      (pResData,(ResourceArray *)&sLength,dest,capacity,errorCode);
    return iVar1;
  }
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (dest == (UnicodeString *)0x0) {
    if (capacity != 0) goto LAB_0034f6f5;
  }
  else {
    if (capacity < 0) {
LAB_0034f6f5:
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
    if (capacity != 0) {
      local_60[0].p_ = res_getString_63(this->pResData,this->res,&sLength);
      if (local_60[0].p_ != (UChar *)0x0) {
        icu_63::UnicodeString::setTo(dest,'\x01',local_60,sLength);
        return 1;
      }
      *errorCode = U_RESOURCE_TYPE_MISMATCH;
      return 0;
    }
  }
  *errorCode = U_BUFFER_OVERFLOW_ERROR;
  return 1;
}

Assistant:

int32_t ResourceDataValue::getStringArrayOrStringAsArray(UnicodeString *dest, int32_t capacity,
                                                         UErrorCode &errorCode) const {
    if(URES_IS_ARRAY(res)) {
        return ::getStringArray(pResData, getArray(errorCode), dest, capacity, errorCode);
    }
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(capacity < 1) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 1;
    }
    int32_t sLength;
    const UChar *s = res_getString(pResData, res, &sLength);
    if(s != NULL) {
        dest[0].setTo(TRUE, s, sLength);
        return 1;
    }
    errorCode = U_RESOURCE_TYPE_MISMATCH;
    return 0;
}